

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NewFrame(void)

{
  ImDrawList *pIVar1;
  float *pfVar2;
  ImGuiNavMoveResult *pIVar3;
  ImGuiNextWindowData *pIVar4;
  ImVec2 *pIVar5;
  ImVec2 *pIVar6;
  char *pcVar7;
  ImVec2 IVar8;
  undefined1 auVar9 [16];
  byte bVar10;
  ImGuiContext *pIVar11;
  ImGuiContext *pIVar12;
  bool bVar13;
  bool bVar14;
  int i;
  ImGuiID IVar15;
  ImGuiKeyModFlags IVar16;
  ImGuiInputSource IVar17;
  ImGuiNavForward IVar18;
  int iVar19;
  ImFont **ppIVar20;
  ImFont *font;
  ImGuiWindow *pIVar21;
  ImGuiPopupData *pIVar22;
  ImGuiWindow **ppIVar23;
  ImRect *pIVar24;
  int i_1;
  ImGuiID IVar25;
  ImGuiWindow *pIVar26;
  ImGuiWindow *window;
  long lVar27;
  ImGuiNavDirSourceFlags dir_sources;
  ImGuiWindow *parent_window_1;
  ImGuiNavMoveResult *pIVar28;
  ImGuiContext *g;
  float *pfVar29;
  ImGuiNavLayer IVar30;
  ImFontAtlas *pIVar31;
  float *pfVar32;
  ImGuiWindow *old_nav_window;
  int n;
  long lVar33;
  bool *pbVar34;
  ImGuiWindow *child_window;
  ImGuiContext *pIVar35;
  bool bVar36;
  bool bVar37;
  byte bVar38;
  uint uVar39;
  uint uVar40;
  float fVar41;
  float fVar42;
  ImVec2 IVar43;
  ImVec2 IVar44;
  ImVec2 IVar45;
  ImVec2 IVar46;
  ImVec2 IVar47;
  ImVec2 IVar49;
  double dVar48;
  undefined1 auVar50 [16];
  float fVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar57;
  long lStack_80;
  ImRect local_48;
  
  bVar38 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0xe75,"NewFrame","ImGui ASSERT FAILED: %s",
                "GImGui != NULL && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
               );
  }
  pIVar11 = GImGui;
  if (GImGui->Initialized == false) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a81,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s","g.Initialized");
  }
  if (((pIVar11->IO).DeltaTime <= 0.0) && (pIVar11->FrameCount != 0)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a82,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\"");
  }
  if ((pIVar11->FrameCount != 0) && (pIVar11->FrameCountEnded != pIVar11->FrameCount)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a83,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
               );
  }
  if (((pIVar11->IO).DisplaySize.x < 0.0) || ((pIVar11->IO).DisplaySize.y < 0.0)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a84,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
               );
  }
  pIVar31 = (pIVar11->IO).Fonts;
  if ((pIVar31->Fonts).Size < 1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a85,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
               );
    pIVar31 = (pIVar11->IO).Fonts;
  }
  ppIVar20 = ImVector<ImFont_*>::operator[](&pIVar31->Fonts,0);
  if ((*ppIVar20)->ContainerAtlas == (ImFontAtlas *)0x0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a86,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
               );
  }
  if ((pIVar11->Style).CurveTessellationTol <= 0.0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a87,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"");
  }
  if ((pIVar11->Style).CircleSegmentMaxError <= 0.0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a88,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.Style.CircleSegmentMaxError > 0.0f && \"Invalid style setting!\"");
  }
  fVar41 = (pIVar11->Style).Alpha;
  if ((fVar41 < 0.0) || (1.0 < fVar41)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a89,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!\""
               );
  }
  if (((pIVar11->Style).WindowMinSize.x < 1.0) || ((pIVar11->Style).WindowMinSize.y < 1.0)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a8a,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
               );
  }
  if (2 < (pIVar11->Style).WindowMenuButtonPosition + 1U) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a8b,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
               );
  }
  for (lVar33 = 0; lVar33 != 0x16; lVar33 = lVar33 + 1) {
    if (0x200 < (pIVar11->IO).KeyMap[lVar33] + 1U) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x1a8d,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                  "g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < IM_ARRAYSIZE(g.IO.KeysDown) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                 );
    }
  }
  if ((((pIVar11->IO).ConfigFlags & 1) != 0) && ((pIVar11->IO).KeyMap[0xc] == -1)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a91,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
               );
  }
  if (((pIVar11->IO).ConfigWindowsResizeFromEdges == true) &&
     (((pIVar11->IO).BackendFlags & 2) == 0)) {
    (pIVar11->IO).ConfigWindowsResizeFromEdges = false;
  }
  pIVar35 = GImGui;
  if (GImGui->SettingsLoaded == false) {
    if ((GImGui->SettingsWindows).Buf.Size != 0) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x25e3,"UpdateSettings","ImGui ASSERT FAILED: %s","g.SettingsWindows.empty()");
    }
    pcVar7 = (pIVar35->IO).IniFilename;
    if (pcVar7 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar7);
    }
    pIVar35->SettingsLoaded = true;
  }
  if ((0.0 < pIVar35->SettingsDirtyTimer) &&
     (fVar41 = pIVar35->SettingsDirtyTimer - (pIVar35->IO).DeltaTime,
     pIVar35->SettingsDirtyTimer = fVar41, fVar41 <= 0.0)) {
    pcVar7 = (pIVar35->IO).IniFilename;
    if (pcVar7 == (char *)0x0) {
      (pIVar35->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar7);
    }
    pIVar35->SettingsDirtyTimer = 0.0;
  }
  pIVar11->Time = (double)(pIVar11->IO).DeltaTime + pIVar11->Time;
  pIVar11->WithinFrameScope = true;
  pIVar11->FrameCount = pIVar11->FrameCount + 1;
  pIVar11->TooltipOverrideCount = 0;
  pIVar11->WindowsActiveCount = 0;
  ImVector<unsigned_int>::resize(&pIVar11->MenusIdSubmittedThisFrame,0);
  fVar41 = (pIVar11->IO).DeltaTime;
  iVar19 = pIVar11->FramerateSecPerFrameIdx;
  pIVar11->FramerateSecPerFrameAccum =
       (fVar41 - pIVar11->FramerateSecPerFrame[iVar19]) + pIVar11->FramerateSecPerFrameAccum;
  pIVar11->FramerateSecPerFrame[iVar19] = fVar41;
  pIVar11->FramerateSecPerFrameIdx = (iVar19 + 1) % 0x78;
  uVar39 = -(uint)(0.0 < pIVar11->FramerateSecPerFrameAccum);
  (pIVar11->IO).Framerate =
       (float)(~uVar39 & 0x7f7fffff |
              (uint)(1.0 / (pIVar11->FramerateSecPerFrameAccum / 120.0)) & uVar39);
  ((pIVar11->IO).Fonts)->Locked = true;
  font = GetDefaultFont();
  SetCurrentFont(font);
  if (pIVar11->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0xe92,"NewFrame","ImGui ASSERT FAILED: %s","g.Font->IsLoaded()");
  }
  fVar41 = (pIVar11->IO).DisplaySize.x;
  fVar51 = (pIVar11->IO).DisplaySize.y;
  (pIVar11->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar11->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar11->DrawListSharedData).ClipRectFullscreen.z = fVar41;
  (pIVar11->DrawListSharedData).ClipRectFullscreen.w = fVar51;
  fVar41 = (pIVar11->Style).CircleSegmentMaxError;
  (pIVar11->DrawListSharedData).CurveTessellationTol = (pIVar11->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleSegmentMaxError(&pIVar11->DrawListSharedData,fVar41);
  bVar13 = (pIVar11->Style).AntiAliasedLines;
  uVar39 = (uint)bVar13;
  (pIVar11->DrawListSharedData).InitialFlags = (uint)bVar13;
  if (((pIVar11->Style).AntiAliasedLinesUseTex == true) &&
     ((pIVar11->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar39 = bVar13 | 2;
    (pIVar11->DrawListSharedData).InitialFlags = uVar39;
  }
  if ((pIVar11->Style).AntiAliasedFill == true) {
    uVar39 = uVar39 | 4;
    (pIVar11->DrawListSharedData).InitialFlags = uVar39;
  }
  if (((pIVar11->IO).BackendFlags & 8) != 0) {
    (pIVar11->DrawListSharedData).InitialFlags = uVar39 | 8;
  }
  pIVar1 = &pIVar11->BackgroundDrawList;
  ImDrawList::_ResetForNewFrame(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar11->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  pIVar1 = &pIVar11->ForegroundDrawList;
  ImDrawList::_ResetForNewFrame(pIVar1);
  ImDrawList::PushTextureID(pIVar1,((pIVar11->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar1);
  (pIVar11->DrawData).Valid = false;
  (pIVar11->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar11->DrawData).CmdListsCount = 0;
  (pIVar11->DrawData).TotalIdxCount = 0;
  (pIVar11->DrawData).TotalVtxCount = 0;
  (pIVar11->DrawData).DisplayPos.x = 0.0;
  *(undefined8 *)&(pIVar11->DrawData).DisplayPos.y = 0;
  (pIVar11->DrawData).DisplaySize.x = 0.0;
  (pIVar11->DrawData).DisplaySize.y = 0.0;
  (pIVar11->DrawData).FramebufferScale.x = 0.0;
  (pIVar11->DrawData).FramebufferScale.y = 0.0;
  if ((pIVar11->DragDropActive == true) &&
     (IVar25 = (pIVar11->DragDropPayload).SourceId, IVar25 == pIVar11->ActiveId)) {
    KeepAliveID(IVar25);
  }
  if (pIVar11->HoveredIdPreviousFrame == 0) {
    IVar25 = pIVar11->HoveredId;
    pIVar11->HoveredIdTimer = 0.0;
    pIVar11->HoveredIdNotActiveTimer = 0.0;
    if (IVar25 == 0) goto LAB_001d70bf;
LAB_001d7098:
    fVar41 = (pIVar11->IO).DeltaTime;
    pIVar11->HoveredIdTimer = pIVar11->HoveredIdTimer + fVar41;
    IVar15 = IVar25;
    if (pIVar11->ActiveId != IVar25) {
      pIVar11->HoveredIdNotActiveTimer = fVar41 + pIVar11->HoveredIdNotActiveTimer;
      IVar15 = pIVar11->ActiveId;
    }
  }
  else {
    IVar25 = pIVar11->HoveredId;
    if (IVar25 != 0) {
      if (pIVar11->ActiveId == IVar25) {
        pIVar11->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_001d7098;
    }
LAB_001d70bf:
    IVar25 = 0;
    IVar15 = pIVar11->ActiveId;
  }
  pIVar11->HoveredIdPreviousFrame = IVar25;
  pIVar11->HoveredId = 0;
  pIVar11->HoveredIdAllowOverlap = false;
  if (((pIVar11->ActiveIdIsAlive != IVar15) && (IVar15 != 0)) &&
     (pIVar11->ActiveIdPreviousFrame == IVar15)) {
    ClearActiveID();
    IVar15 = pIVar11->ActiveId;
  }
  fVar41 = (pIVar11->IO).DeltaTime;
  if (IVar15 != 0) {
    pIVar11->ActiveIdTimer = pIVar11->ActiveIdTimer + fVar41;
  }
  pIVar11->LastActiveIdTimer = pIVar11->LastActiveIdTimer + fVar41;
  pIVar11->ActiveIdPreviousFrame = IVar15;
  pIVar11->ActiveIdPreviousFrameWindow = pIVar11->ActiveIdWindow;
  pIVar11->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar11->ActiveIdHasBeenEditedBefore;
  pIVar11->ActiveIdIsAlive = 0;
  pIVar11->ActiveIdHasBeenEditedThisFrame = false;
  pIVar11->ActiveIdPreviousFrameIsAlive = false;
  pIVar11->ActiveIdIsJustActivated = false;
  if (pIVar11->TempInputId == 0) {
LAB_001d718d:
    if (IVar15 == 0) {
      pIVar11->ActiveIdUsingNavDirMask = 0;
      pIVar11->ActiveIdUsingNavInputMask = 0;
      pIVar11->ActiveIdUsingKeyInputMask = 0;
    }
  }
  else if (IVar15 != pIVar11->TempInputId) {
    pIVar11->TempInputId = 0;
    goto LAB_001d718d;
  }
  pIVar11->DragDropAcceptIdPrev = pIVar11->DragDropAcceptIdCurr;
  pIVar11->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar11->DragDropAcceptIdCurr = 0;
  pIVar11->DragDropWithinSource = false;
  pIVar11->DragDropWithinTarget = false;
  pIVar11->DragDropHoldJustPressedId = 0;
  IVar16 = GetMergedKeyModFlags();
  (pIVar11->IO).KeyMods = IVar16;
  pfVar2 = (pIVar11->IO).KeysDownDuration;
  memcpy((pIVar11->IO).KeysDownDurationPrev,pfVar2,0x800);
  for (lVar33 = 0; pIVar35 = GImGui, lVar33 != 0x200; lVar33 = lVar33 + 1) {
    fVar51 = -1.0;
    if ((pIVar11->IO).KeysDown[lVar33] == true) {
      fVar51 = 0.0;
      if (0.0 <= pfVar2[lVar33]) {
        fVar51 = pfVar2[lVar33] + fVar41;
      }
    }
    pfVar2[lVar33] = fVar51;
  }
  (GImGui->IO).WantSetMousePos = false;
  pIVar35->NavWrapRequestWindow = (ImGuiWindow *)0x0;
  pIVar35->NavWrapRequestFlags = 0;
  uVar39 = (pIVar35->IO).ConfigFlags;
  if (((uVar39 & 2) == 0) || (((pIVar35->IO).BackendFlags & 1) == 0)) {
    bVar10 = 0;
  }
  else if (((0.0 < (pIVar35->IO).NavInputs[0]) || (0.0 < (pIVar35->IO).NavInputs[2])) ||
          ((0.0 < (pIVar35->IO).NavInputs[1] || (bVar10 = 1, 0.0 < (pIVar35->IO).NavInputs[3])))) {
    pIVar35->NavInputSource = ImGuiInputSource_NavGamepad;
    bVar10 = 1;
  }
  if ((uVar39 & 1) != 0) {
    bVar13 = IsKeyDown((pIVar35->IO).KeyMap[0xc]);
    if (bVar13) {
      (pIVar35->IO).NavInputs[0] = 1.0;
      pIVar35->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar13 = IsKeyDown((pIVar35->IO).KeyMap[0xd]);
    if (bVar13) {
      (pIVar35->IO).NavInputs[2] = 1.0;
      pIVar35->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar13 = IsKeyDown((pIVar35->IO).KeyMap[0xe]);
    if (bVar13) {
      (pIVar35->IO).NavInputs[1] = 1.0;
      pIVar35->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar13 = IsKeyDown((pIVar35->IO).KeyMap[1]);
    if (bVar13) {
      (pIVar35->IO).NavInputs[0x11] = 1.0;
      pIVar35->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar13 = IsKeyDown((pIVar35->IO).KeyMap[2]);
    if (bVar13) {
      (pIVar35->IO).NavInputs[0x12] = 1.0;
      pIVar35->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar13 = IsKeyDown((pIVar35->IO).KeyMap[3]);
    if (bVar13) {
      (pIVar35->IO).NavInputs[0x13] = 1.0;
      pIVar35->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar13 = IsKeyDown((pIVar35->IO).KeyMap[4]);
    if (bVar13) {
      (pIVar35->IO).NavInputs[0x14] = 1.0;
      pIVar35->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar13 = (pIVar35->IO).KeyCtrl;
    if (bVar13 == true) {
      (pIVar35->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar35->IO).KeyShift == true) {
      (pIVar35->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar13 == false) && ((pIVar35->IO).KeyAlt != false)) {
      (pIVar35->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar2 = (pIVar35->IO).NavInputsDownDuration;
  pfVar29 = pfVar2;
  pfVar32 = (pIVar35->IO).NavInputsDownDurationPrev;
  for (lVar33 = 0x15; lVar33 != 0; lVar33 = lVar33 + -1) {
    *pfVar32 = *pfVar29;
    pfVar29 = pfVar29 + (ulong)bVar38 * -2 + 1;
    pfVar32 = pfVar32 + (ulong)bVar38 * -2 + 1;
  }
  for (lVar33 = 0; lVar33 != 0x15; lVar33 = lVar33 + 1) {
    fVar41 = -1.0;
    if (0.0 < (pIVar35->IO).NavInputs[lVar33]) {
      fVar41 = 0.0;
      if (0.0 <= pfVar2[lVar33]) {
        fVar41 = pfVar2[lVar33] + (pIVar35->IO).DeltaTime;
      }
    }
    pfVar2[lVar33] = fVar41;
  }
  IVar25 = pIVar35->NavInitResultId;
  if ((IVar25 != 0) &&
     (((pIVar35->NavDisableHighlight != true || (pIVar35->NavInitRequestFromMove == true)) &&
      (pIVar35->NavWindow != (ImGuiWindow *)0x0)))) {
    if (pIVar35->NavInitRequestFromMove == true) {
      SetNavIDWithRectRel(IVar25,pIVar35->NavLayer,0,&pIVar35->NavInitResultRectRel);
    }
    else {
      SetNavID(IVar25,pIVar35->NavLayer,0);
    }
    IVar43 = (pIVar35->NavInitResultRectRel).Max;
    pIVar5 = &pIVar35->NavWindow->NavRectRel[pIVar35->NavLayer].Min;
    *pIVar5 = (pIVar35->NavInitResultRectRel).Min;
    pIVar5[1] = IVar43;
  }
  pIVar35->NavInitRequest = false;
  pIVar35->NavInitRequestFromMove = false;
  pIVar35->NavInitResultId = 0;
  pIVar35->NavJustMovedToId = 0;
  pIVar12 = GImGui;
  if (pIVar35->NavMoveRequest == true) {
    IVar25 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar25 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId != 0) {
        pIVar12->NavDisableHighlight = false;
        pIVar12->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar3 = &GImGui->NavMoveResultOther;
      pIVar28 = &GImGui->NavMoveResultLocal;
      if (IVar25 == 0) {
        pIVar28 = pIVar3;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20) != 0) &&
          (IVar25 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar25 != 0)) &&
         (IVar25 != GImGui->NavId)) {
        pIVar28 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (pIVar28 == pIVar3) {
LAB_001d7599:
        pIVar28 = pIVar3;
      }
      else if (((GImGui->NavMoveResultOther).ID != 0) &&
              (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar41 = (GImGui->NavMoveResultOther).DistBox;
        fVar51 = pIVar28->DistBox;
        if (fVar51 <= fVar41) {
          if (((fVar41 != fVar51) || (NAN(fVar41) || NAN(fVar51))) ||
             (pfVar2 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar28->DistCenter < *pfVar2 || pIVar28->DistCenter == *pfVar2)) goto LAB_001d759c;
        }
        goto LAB_001d7599;
      }
LAB_001d759c:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) || (pIVar28->Window == (ImGuiWindow *)0x0)) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                    ,0x2248,"NavUpdateMoveResult","ImGui ASSERT FAILED: %s",
                    "g.NavWindow && result->Window");
      }
      if (pIVar12->NavLayer == ImGuiNavLayer_Main) {
        if ((pIVar12->NavMoveRequestFlags & 0x40) == 0) {
          IVar43 = pIVar28->Window->Pos;
          IVar45 = (pIVar28->RectRel).Min;
          fVar41 = IVar43.x;
          fVar51 = IVar43.y;
          IVar43 = (pIVar28->RectRel).Max;
          local_48.Max.x = IVar43.x + fVar41;
          local_48.Max.y = IVar43.y + fVar51;
          local_48.Min.y = IVar45.y + fVar51;
          local_48.Min.x = IVar45.x + fVar41;
          IVar43 = ScrollToBringRectIntoView(pIVar28->Window,&local_48);
        }
        else {
          pIVar21 = pIVar28->Window;
          fVar41 = 0.0;
          if (pIVar12->NavMoveDir == 2) {
            fVar41 = (pIVar21->ScrollMax).y;
          }
          IVar43 = (ImVec2)((ulong)(uint)((pIVar21->Scroll).y - fVar41) << 0x20);
          (pIVar21->ScrollTarget).y = fVar41;
          (pIVar21->ScrollTargetCenterRatio).y = 0.0;
        }
        fVar41 = (pIVar28->RectRel).Min.y;
        fVar51 = (pIVar28->RectRel).Max.x;
        fVar52 = (pIVar28->RectRel).Max.y;
        (pIVar28->RectRel).Min.x = (pIVar28->RectRel).Min.x - IVar43.x;
        (pIVar28->RectRel).Min.y = fVar41 - IVar43.y;
        (pIVar28->RectRel).Max.x = fVar51 - IVar43.x;
        (pIVar28->RectRel).Max.y = fVar52 - IVar43.y;
      }
      ClearActiveID();
      pIVar12->NavWindow = pIVar28->Window;
      IVar25 = pIVar28->ID;
      if (pIVar12->NavId == IVar25) {
        IVar15 = pIVar28->FocusScopeId;
      }
      else {
        pIVar12->NavJustMovedToId = IVar25;
        IVar15 = pIVar28->FocusScopeId;
        pIVar12->NavJustMovedToFocusScopeId = IVar15;
        pIVar12->NavJustMovedToKeyMods = pIVar12->NavMoveRequestKeyMods;
      }
      SetNavIDWithRectRel(IVar25,pIVar12->NavLayer,IVar15,&pIVar28->RectRel);
      pIVar12->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar35->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar35->NavMoveRequest == false) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x2152,"NavUpdate","ImGui ASSERT FAILED: %s","g.NavMoveRequest");
    }
    if (((pIVar35->NavMoveResultLocal).ID == 0) && ((pIVar35->NavMoveResultOther).ID == 0)) {
      pIVar35->NavDisableHighlight = false;
    }
    pIVar35->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar35->NavMousePosDirty == true) && (pIVar35->NavIdIsAlive == true)) {
    if ((((pIVar35->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar35->IO).BackendFlags & 4) != 0 && (pIVar35->NavDisableHighlight == false)) &&
         (pIVar35->NavDisableMouseHover == true)) && (pIVar35->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar43 = NavCalcPreferredRefPos();
      (pIVar35->IO).MousePosPrev = IVar43;
      (pIVar35->IO).MousePos = IVar43;
      (pIVar35->IO).WantSetMousePos = true;
    }
    pIVar35->NavMousePosDirty = false;
  }
  pIVar35->NavIdIsAlive = false;
  pIVar35->NavJustTabbedId = 0;
  if (ImGuiNavLayer_Menu < pIVar35->NavLayer) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x2168,"NavUpdate","ImGui ASSERT FAILED: %s","g.NavLayer == 0 || g.NavLayer == 1");
  }
  pIVar21 = pIVar35->NavWindow;
  pIVar26 = pIVar21;
  if (pIVar21 != (ImGuiWindow *)0x0) {
    for (; pIVar26 != (ImGuiWindow *)0x0; pIVar26 = pIVar26->ParentWindow) {
      if ((pIVar26->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar26 != pIVar21) {
          pIVar26->NavLastChildNavWindow = pIVar21;
        }
        break;
      }
    }
    if ((pIVar21->NavLastChildNavWindow != (ImGuiWindow *)0x0) &&
       (pIVar35->NavLayer == ImGuiNavLayer_Main)) {
      pIVar21->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar12 = GImGui;
  pIVar21 = GetTopMostPopupModal();
  if (pIVar21 == (ImGuiWindow *)0x0) {
    if (pIVar12->NavWindowingTargetAnim == (ImGuiWindow *)0x0) {
      if (pIVar12->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_001d7892;
LAB_001d7899:
      bVar13 = IsNavInputTest(3,ImGuiInputReadMode_Pressed);
      if (((pIVar12->NavWindowingTarget == (ImGuiWindow *)0x0) && ((pIVar12->IO).KeyCtrl == true))
         && (bVar36 = IsKeyPressedMap(0,true), bVar36)) {
        bVar38 = (byte)(pIVar12->IO).ConfigFlags;
        uVar40 = (uint)bVar38;
        if (bVar13 || (bVar38 & 1) != 0) {
LAB_001d78dc:
          pIVar21 = pIVar12->NavWindow;
          if ((pIVar21 != (ImGuiWindow *)0x0) ||
             (pIVar21 = FindWindowNavFocusable
                                  ((pIVar12->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
             pIVar21 != (ImGuiWindow *)0x0)) {
            pIVar21 = pIVar21->RootWindow;
            pIVar12->NavWindowingTargetAnim = pIVar21;
            pIVar12->NavWindowingTarget = pIVar21;
            pIVar12->NavWindowingTimer = 0.0;
            pIVar12->NavWindowingHighlightAlpha = 0.0;
            pIVar12->NavWindowingToggleLayer = (bool)(~(byte)uVar40 & 1);
            pIVar12->NavInputSource = ImGuiInputSource_NavGamepad - (uVar40 & 1);
          }
        }
      }
      else if (bVar13) {
        uVar40 = 0;
        goto LAB_001d78dc;
      }
      bVar13 = pIVar12->NavWindowingTarget == (ImGuiWindow *)0x0;
    }
    else {
      if (pIVar12->NavWindowingTarget == (ImGuiWindow *)0x0) {
        fVar41 = (pIVar12->IO).DeltaTime * -10.0 + pIVar12->NavWindowingHighlightAlpha;
        fVar41 = (float)(-(uint)(0.0 <= fVar41) & (uint)fVar41);
        pIVar12->NavWindowingHighlightAlpha = fVar41;
        if ((pIVar12->DimBgRatio <= 0.0) && (fVar41 <= 0.0)) {
          pIVar12->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
        }
        goto LAB_001d7899;
      }
LAB_001d7892:
      bVar13 = false;
    }
    fVar41 = (pIVar12->IO).DeltaTime + pIVar12->NavWindowingTimer;
    pIVar12->NavWindowingTimer = fVar41;
    if (bVar13) {
LAB_001d7aba:
      bVar13 = false;
      pIVar21 = (ImGuiWindow *)0x0;
    }
    else {
      IVar17 = pIVar12->NavInputSource;
      if (IVar17 != ImGuiInputSource_NavGamepad) {
LAB_001d7a2d:
        if (IVar17 == ImGuiInputSource_NavKeyboard) {
          fVar51 = (pIVar12->NavWindowingTimer + -0.2) / 0.05;
          fVar41 = 1.0;
          if (fVar51 <= 1.0) {
            fVar41 = fVar51;
          }
          fVar41 = (float)(~-(uint)(fVar51 < 0.0) & (uint)fVar41);
          uVar40 = -(uint)(fVar41 <= pIVar12->NavWindowingHighlightAlpha);
          pIVar12->NavWindowingHighlightAlpha =
               (float)(uVar40 & (uint)pIVar12->NavWindowingHighlightAlpha | ~uVar40 & (uint)fVar41);
          bVar13 = IsKeyPressedMap(0,true);
          if (bVar13) {
            NavUpdateWindowingHighlightWindow((pIVar12->IO).KeyShift - 1 | 1);
          }
          if ((pIVar12->IO).KeyCtrl == false) {
            pIVar21 = pIVar12->NavWindowingTarget;
            bVar13 = false;
            goto LAB_001d7ac5;
          }
        }
        goto LAB_001d7aba;
      }
      fVar51 = (fVar41 + -0.2) / 0.05;
      fVar41 = 1.0;
      if (fVar51 <= 1.0) {
        fVar41 = fVar51;
      }
      fVar41 = (float)(~-(uint)(fVar51 < 0.0) & (uint)fVar41);
      uVar40 = -(uint)(fVar41 <= pIVar12->NavWindowingHighlightAlpha);
      pIVar12->NavWindowingHighlightAlpha =
           (float)(uVar40 & (uint)pIVar12->NavWindowingHighlightAlpha | ~uVar40 & (uint)fVar41);
      bVar13 = IsNavInputTest(0xc,ImGuiInputReadMode_RepeatSlow);
      bVar36 = IsNavInputTest(0xd,ImGuiInputReadMode_RepeatSlow);
      if ((uint)bVar13 - (uint)bVar36 != 0) {
        NavUpdateWindowingHighlightWindow((uint)bVar13 - (uint)bVar36);
        pIVar12->NavWindowingHighlightAlpha = 1.0;
      }
      if (0.0 < (GImGui->IO).NavInputs[3]) {
        if (pIVar12->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_001d7aba;
        IVar17 = pIVar12->NavInputSource;
        goto LAB_001d7a2d;
      }
      pbVar34 = &pIVar12->NavWindowingToggleLayer;
      *pbVar34 = (bool)(*pbVar34 &
                       (pIVar12->NavWindowingHighlightAlpha <= 1.0 &&
                       pIVar12->NavWindowingHighlightAlpha != 1.0));
      if (*pbVar34 == false) {
        pIVar21 = pIVar12->NavWindowingTarget;
        bVar13 = false;
      }
      else {
        bVar13 = pIVar12->NavWindow != (ImGuiWindow *)0x0;
        pIVar21 = (ImGuiWindow *)0x0;
      }
      pIVar12->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
LAB_001d7ac5:
    dir_sources = 1;
    bVar36 = IsNavInputTest(0x10,ImGuiInputReadMode_Pressed);
    if (bVar36) {
      pIVar12->NavWindowingToggleLayer = true;
    }
    if (((pIVar12->ActiveId == 0) || (pIVar12->ActiveIdAllowOverlap == true)) &&
       ((pIVar12->NavWindowingToggleLayer == true &&
        (bVar36 = IsNavInputTest(0x10,ImGuiInputReadMode_Released), bVar36)))) {
      bVar36 = IsMousePosValid(&(pIVar12->IO).MousePos);
      bVar37 = IsMousePosValid(&(pIVar12->IO).MousePosPrev);
      bVar13 = (bool)(bVar37 == bVar36 | bVar13);
    }
    pIVar26 = pIVar12->NavWindowingTarget;
    if ((pIVar26 != (ImGuiWindow *)0x0) && ((pIVar26->Flags & 4) == 0)) {
      if (pIVar12->NavInputSource == ImGuiInputSource_NavGamepad) {
        dir_sources = 4;
LAB_001d7bcb:
        IVar43 = GetNavInputAmount2d(dir_sources,ImGuiInputReadMode_Down,0.0,0.0);
      }
      else {
        IVar43.x = 0.0;
        IVar43.y = 0.0;
        if ((pIVar12->NavInputSource == ImGuiInputSource_NavKeyboard) &&
           ((pIVar12->IO).KeyShift == false)) goto LAB_001d7bcb;
      }
      fVar41 = IVar43.x;
      fVar51 = IVar43.y;
      if ((((fVar41 != 0.0) || (NAN(fVar41))) || (fVar51 != 0.0)) || (NAN(fVar51))) {
        fVar52 = (pIVar12->IO).DisplayFramebufferScale.x;
        fVar42 = (pIVar12->IO).DisplayFramebufferScale.y;
        if (fVar42 <= fVar52) {
          fVar52 = fVar42;
        }
        fVar52 = (float)(int)(fVar52 * (pIVar12->IO).DeltaTime * 800.0);
        IVar43 = pIVar26->RootWindow->Pos;
        local_48.Min.y = IVar43.y + fVar51 * fVar52;
        local_48.Min.x = IVar43.x + fVar41 * fVar52;
        SetWindowPos(pIVar26->RootWindow,&local_48.Min,1);
        pIVar12->NavDisableMouseHover = true;
        MarkIniSettingsDirty(pIVar12->NavWindowingTarget);
      }
    }
    if (pIVar21 != (ImGuiWindow *)0x0) {
      if ((pIVar12->NavWindow == (ImGuiWindow *)0x0) || (pIVar21 != pIVar12->NavWindow->RootWindow))
      {
        ClearActiveID();
        pIVar12->NavDisableHighlight = false;
        pIVar12->NavDisableMouseHover = true;
        pIVar26 = pIVar21->NavLastChildNavWindow;
        if (pIVar21->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
          pIVar26 = pIVar21;
        }
        ClosePopupsOverWindow(pIVar26,false);
        FocusWindow(pIVar26);
        if (pIVar26->NavLastIds[0] == 0) {
          NavInitWindow(pIVar26,false);
        }
        if ((pIVar26->DC).NavLayerActiveMask == 2) {
          pIVar12->NavLayer = ImGuiNavLayer_Menu;
        }
      }
      pIVar12->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((bVar13) && (pIVar21 = pIVar12->NavWindow, pIVar26 = pIVar21, pIVar21 != (ImGuiWindow *)0x0)
       ) {
      while (window = pIVar26, window->ParentWindow != (ImGuiWindow *)0x0) {
        if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
           (pIVar26 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
      }
      if (window != pIVar21) {
        FocusWindow(window);
        window->NavLastChildNavWindow = pIVar21;
        pIVar21 = pIVar12->NavWindow;
      }
      pIVar12->NavDisableHighlight = false;
      pIVar12->NavDisableMouseHover = true;
      IVar30 = ImGuiNavLayer_Main;
      if (((pIVar21->DC).NavLayerActiveMask & 2) != 0) {
        IVar30 = pIVar12->NavLayer ^ ImGuiNavLayer_Menu;
      }
      NavRestoreLayer(IVar30);
    }
  }
  else {
    pIVar12->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if (((bool)((uVar39 & 1) == 0 & (bVar10 ^ 1))) || (pIVar35->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar35->IO).NavActive = false;
LAB_001d7da1:
    bVar13 = pIVar35->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar13 = (pIVar35->NavWindow->Flags & 0x40000U) == 0;
    (pIVar35->IO).NavActive = bVar13;
    if (((!bVar13) || (pIVar35->NavId == 0)) ||
       (bVar13 = true, pIVar35->NavDisableHighlight != false)) goto LAB_001d7da1;
  }
  (pIVar35->IO).NavVisible = bVar13;
  bVar13 = IsNavInputTest(1,ImGuiInputReadMode_Pressed);
  if (bVar13) {
    if (pIVar35->ActiveId == 0) {
      pIVar21 = pIVar35->NavWindow;
      if (((pIVar21 == (ImGuiWindow *)0x0) || ((pIVar21->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar26 = pIVar21->ParentWindow, pIVar26 == (ImGuiWindow *)0x0)) {
        if ((pIVar35->OpenPopupStack).Size < 1) {
          if (pIVar35->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar21 != (ImGuiWindow *)0x0) && ((pIVar21->Flags & 0x5000000U) != 0x1000000)) {
              pIVar21->NavLastIds[0] = 0;
            }
            pIVar35->NavId = 0;
            pIVar35->NavFocusScopeId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else {
          pIVar22 = ImVector<ImGuiPopupData>::back(&pIVar35->OpenPopupStack);
          if ((pIVar22->Window->Flags & 0x8000000) == 0) {
            ClosePopupToLevel((pIVar35->OpenPopupStack).Size + -1,true);
          }
        }
      }
      else {
        if (pIVar21->ChildId == 0) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                      ,0x2184,"NavUpdate","ImGui ASSERT FAILED: %s","child_window->ChildId != 0");
        }
        FocusWindow(pIVar26);
        SetNavID(pIVar21->ChildId,0,0);
        pIVar35->NavIdIsAlive = false;
        if (pIVar35->NavDisableMouseHover == true) {
          pIVar35->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
  pIVar35->NavActivateId = 0;
  pIVar35->NavActivateDownId = 0;
  pIVar35->NavActivatePressedId = 0;
  pIVar35->NavInputId = 0;
  if (((pIVar35->NavId == 0) || (pIVar35->NavDisableHighlight != false)) ||
     (pIVar35->NavWindowingTarget != (ImGuiWindow *)0x0)) {
LAB_001d7f4e:
    if ((pIVar35->NavWindow != (ImGuiWindow *)0x0) && ((pIVar35->NavWindow->Flags & 0x40000) != 0))
    {
      pIVar35->NavDisableHighlight = true;
    }
  }
  else if (pIVar35->NavWindow != (ImGuiWindow *)0x0) {
    if ((pIVar35->NavWindow->Flags & 0x40000) == 0) {
      if (0.0 < (GImGui->IO).NavInputs[0]) {
        bVar13 = IsNavInputTest(0,ImGuiInputReadMode_Pressed);
        IVar25 = pIVar35->ActiveId;
        IVar15 = pIVar35->NavId;
        if (IVar25 == 0 && bVar13) {
          pIVar35->NavActivateId = IVar15;
          pIVar35->NavActivateDownId = IVar15;
LAB_001d83c5:
          pIVar35->NavActivatePressedId = IVar15;
        }
        else if (IVar25 == 0) {
          pIVar35->NavActivateDownId = IVar15;
          if (bVar13) goto LAB_001d83c5;
        }
        else {
          bVar36 = IVar25 == IVar15;
          if (!bVar36) goto LAB_001d7f4e;
          pIVar35->NavActivateDownId = IVar25;
          IVar15 = IVar25;
          if (bVar13 && bVar36) goto LAB_001d83c5;
        }
LAB_001d83cc:
        bVar13 = IsNavInputTest(2,ImGuiInputReadMode_Pressed);
        if (bVar13) {
          pIVar35->NavInputId = pIVar35->NavId;
        }
      }
      else if (pIVar35->ActiveId == pIVar35->NavId || pIVar35->ActiveId == 0) goto LAB_001d83cc;
    }
    goto LAB_001d7f4e;
  }
  IVar25 = pIVar35->NavActivateId;
  if ((IVar25 != 0) && (pIVar35->NavActivateDownId != IVar25)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x21b2,"NavUpdate","ImGui ASSERT FAILED: %s",
                "g.NavActivateDownId == g.NavActivateId");
  }
  pIVar35->NavMoveRequest = false;
  IVar25 = pIVar35->NavNextActivateId;
  if (IVar25 != 0) {
    pIVar35->NavActivateId = IVar25;
    pIVar35->NavActivateDownId = IVar25;
    pIVar35->NavActivatePressedId = IVar25;
    pIVar35->NavInputId = IVar25;
  }
  pIVar35->NavNextActivateId = 0;
  IVar18 = pIVar35->NavMoveRequestForward;
  if (IVar18 == ImGuiNavForward_None) {
    pIVar35->NavMoveDir = -1;
    pIVar35->NavMoveRequestFlags = 0;
    if (((pIVar35->NavWindow != (ImGuiWindow *)0x0) &&
        (pIVar35->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar35->NavWindow->Flags & 0x40000) == 0)) {
      if (((GImGui->ActiveIdUsingNavDirMask & 1) == 0) &&
         ((bVar13 = IsNavInputTest(4,ImGuiInputReadMode_Repeat), bVar13 ||
          (bVar13 = IsNavInputTest(0x11,ImGuiInputReadMode_Repeat), bVar13)))) {
        pIVar35->NavMoveDir = 0;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 2) == 0) &&
         ((bVar13 = IsNavInputTest(5,ImGuiInputReadMode_Repeat), bVar13 ||
          (bVar13 = IsNavInputTest(0x12,ImGuiInputReadMode_Repeat), bVar13)))) {
        pIVar35->NavMoveDir = 1;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 4) == 0) &&
         ((bVar13 = IsNavInputTest(6,ImGuiInputReadMode_Repeat), bVar13 ||
          (bVar13 = IsNavInputTest(0x13,ImGuiInputReadMode_Repeat), bVar13)))) {
        pIVar35->NavMoveDir = 2;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 8) == 0) &&
         ((bVar13 = IsNavInputTest(7,ImGuiInputReadMode_Repeat), bVar13 ||
          (bVar13 = IsNavInputTest(0x14,ImGuiInputReadMode_Repeat), bVar13)))) {
        pIVar35->NavMoveDir = 3;
      }
    }
    pIVar35->NavMoveClipDir = pIVar35->NavMoveDir;
  }
  else {
    if ((pIVar35->NavMoveDir == -1) || (pIVar35->NavMoveClipDir == -1)) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x21cd,"NavUpdate","ImGui ASSERT FAILED: %s",
                  "g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None");
      IVar18 = pIVar35->NavMoveRequestForward;
    }
    if (IVar18 != ImGuiNavForward_ForwardQueued) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x21ce,"NavUpdate","ImGui ASSERT FAILED: %s",
                  "g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued");
    }
    pIVar35->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar12 = GImGui;
  fVar41 = 0.0;
  if ((((((uVar39 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
       (pIVar21 = GImGui->NavWindow, pIVar21 != (ImGuiWindow *)0x0)) &&
      (((pIVar21->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    bVar13 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar37 = false;
    bVar36 = false;
    if (bVar13) {
      bVar36 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    bVar13 = IsKeyDown((pIVar12->IO).KeyMap[6]);
    if (bVar13) {
      bVar37 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar13 = IsKeyPressed((pIVar12->IO).KeyMap[7],true);
    if (bVar13) {
      bVar13 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar13 = false;
    }
    bVar14 = IsKeyPressed((pIVar12->IO).KeyMap[8],true);
    if (bVar14) {
      bVar14 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar14 = false;
    }
    fVar41 = 0.0;
    if ((bVar36 != bVar37) || (bVar13 != bVar14)) {
      if (((pIVar21->DC).NavLayerActiveMask == 0) && ((pIVar21->DC).NavHasScroll == true)) {
        bVar36 = IsKeyPressed((pIVar12->IO).KeyMap[5],true);
        if (bVar36) {
          fVar41 = (pIVar21->Scroll).y - ((pIVar21->InnerRect).Max.y - (pIVar21->InnerRect).Min.y);
LAB_001d9420:
          (pIVar21->ScrollTarget).y = fVar41;
        }
        else {
          bVar36 = IsKeyPressed((pIVar12->IO).KeyMap[6],true);
          if (bVar36) {
            fVar41 = ((pIVar21->InnerRect).Max.y - (pIVar21->InnerRect).Min.y) + (pIVar21->Scroll).y
            ;
            goto LAB_001d9420;
          }
          if (bVar13 == false) {
            if (bVar14 == false) goto LAB_001d9429;
            fVar41 = (pIVar21->ScrollMax).y;
            goto LAB_001d9420;
          }
          (pIVar21->ScrollTarget).y = 0.0;
        }
        (pIVar21->ScrollTargetCenterRatio).y = 0.0;
LAB_001d9429:
        fVar41 = 0.0;
      }
      else {
        IVar30 = pIVar12->NavLayer;
        fVar41 = (pIVar21->InnerRect).Max.y;
        fVar51 = (pIVar21->InnerRect).Min.y;
        fVar52 = ImGuiWindow::CalcFontSize(pIVar21);
        fVar41 = (pIVar21->NavRectRel[IVar30].Max.y - pIVar21->NavRectRel[IVar30].Min.y) +
                 ((fVar41 - fVar51) - fVar52);
        fVar41 = (float)(~-(uint)(fVar41 <= 0.0) & (uint)fVar41);
        bVar36 = IsKeyPressed((pIVar12->IO).KeyMap[5],true);
        if (bVar36) {
          fVar41 = -fVar41;
          pIVar12->NavMoveDir = 3;
          pIVar12->NavMoveClipDir = 2;
          pIVar12->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar36 = IsKeyPressed((pIVar12->IO).KeyMap[6],true);
          if (!bVar36) {
            pIVar24 = pIVar21->NavRectRel + IVar30;
            if (bVar13 == false) {
              fVar41 = 0.0;
              if (bVar14 != false) {
                fVar51 = ((pIVar21->ScrollMax).y + (pIVar21->SizeFull).y) - (pIVar21->Scroll).y;
                pIVar21->NavRectRel[IVar30].Max.y = fVar51;
                pIVar21->NavRectRel[IVar30].Min.y = fVar51;
                fVar51 = (pIVar24->Min).x;
                pIVar5 = &pIVar21->NavRectRel[IVar30].Max;
                if (pIVar5->x <= fVar51 && fVar51 != pIVar5->x) {
                  pIVar21->NavRectRel[IVar30].Max.x = 0.0;
                  (pIVar24->Min).x = 0.0;
                }
                pIVar12->NavMoveDir = 2;
                pIVar12->NavMoveRequestFlags = 0x50;
              }
              goto LAB_001d819b;
            }
            fVar41 = -(pIVar21->Scroll).y;
            pIVar21->NavRectRel[IVar30].Max.y = fVar41;
            pIVar21->NavRectRel[IVar30].Min.y = fVar41;
            fVar41 = (pIVar24->Min).x;
            pIVar5 = &pIVar21->NavRectRel[IVar30].Max;
            if (pIVar5->x <= fVar41 && fVar41 != pIVar5->x) {
              pIVar21->NavRectRel[IVar30].Max.x = 0.0;
              (pIVar24->Min).x = 0.0;
            }
            pIVar12->NavMoveDir = 3;
            pIVar12->NavMoveRequestFlags = 0x50;
            goto LAB_001d9429;
          }
          pIVar12->NavMoveDir = 2;
          pIVar12->NavMoveClipDir = 3;
          pIVar12->NavMoveRequestFlags = 0x30;
        }
      }
    }
  }
LAB_001d819b:
  if (pIVar35->NavMoveDir == -1) {
    if ((pIVar35->NavMoveRequest & 1U) != 0) goto LAB_001d81d5;
  }
  else {
    pIVar35->NavMoveRequest = true;
    pIVar35->NavMoveRequestKeyMods = (pIVar35->IO).KeyMods;
    pIVar35->NavMoveDirLast = pIVar35->NavMoveDir;
LAB_001d81d5:
    if (pIVar35->NavId == 0) {
      pIVar35->NavInitRequest = true;
      pIVar35->NavInitRequestFromMove = true;
      pIVar35->NavInitResultId = 0;
      pIVar35->NavDisableHighlight = false;
    }
  }
  NavUpdateAnyRequestFlag();
  pIVar21 = pIVar35->NavWindow;
  if (((pIVar21 != (ImGuiWindow *)0x0) && ((pIVar21->Flags & 0x40000) == 0)) &&
     (pIVar35->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar51 = ImGuiWindow::CalcFontSize(pIVar21);
    fVar51 = (float)(int)(fVar51 * 100.0 * (pIVar35->IO).DeltaTime + 0.5);
    if ((((pIVar21->DC).NavLayerActiveMask == 0) && ((pIVar21->DC).NavHasScroll == true)) &&
       (pIVar35->NavMoveRequest == true)) {
      uVar39 = pIVar35->NavMoveDir;
      if (uVar39 < 2) {
        lVar33 = 0x6c;
        lVar27 = 100;
        uVar40 = 0;
        lStack_80 = 0x54;
      }
      else {
        if ((uVar39 & 0xfffffffe) != 2) goto LAB_001d8457;
        uVar40 = 2;
        lVar33 = 0x70;
        lVar27 = 0x68;
        lStack_80 = 0x58;
      }
      *(float *)((long)&pIVar21->Name + lVar27) =
           (float)(int)(*(float *)(&DAT_00245330 + (ulong)(uVar39 == uVar40) * 4) * fVar51 +
                       *(float *)((long)&pIVar21->Name + lStack_80));
      *(undefined4 *)((long)&pIVar21->Name + lVar33) = 0;
    }
LAB_001d8457:
    IVar43 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar52 = IVar43.x;
    fVar42 = IVar43.y;
    if (((fVar52 != 0.0) || (NAN(fVar52))) && (pIVar21->ScrollbarX == true)) {
      (pIVar21->ScrollTarget).x = (float)(int)(fVar52 * fVar51 + (pIVar21->Scroll).x);
      (pIVar21->ScrollTargetCenterRatio).x = 0.0;
      pIVar35->NavMoveFromClampedRefRect = true;
    }
    if ((fVar42 != 0.0) || (NAN(fVar42))) {
      (pIVar21->ScrollTarget).y = (float)(int)(fVar42 * fVar51 + (pIVar21->Scroll).y);
      (pIVar21->ScrollTargetCenterRatio).y = 0.0;
      pIVar35->NavMoveFromClampedRefRect = true;
    }
  }
  (pIVar35->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar35->NavMoveResultLocal).ID = 0;
  (pIVar35->NavMoveResultLocal).FocusScopeId = 0;
  (pIVar35->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar35->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar35->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar35->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar35->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar35->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar35->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar35->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar35->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar35->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (pIVar35->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar35->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar35->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar35->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar35->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar35->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar35->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar35->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar35->NavMoveResultOther).ID = 0;
  (pIVar35->NavMoveResultOther).FocusScopeId = 0;
  (pIVar35->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar35->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar35->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar35->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar35->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar35->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar35->NavMoveResultOther).RectRel.Max.y = 0.0;
  if (((pIVar35->NavMoveRequest == true) && (pIVar35->NavMoveFromClampedRefRect == true)) &&
     (pIVar35->NavLayer == ImGuiNavLayer_Main)) {
    pIVar21 = pIVar35->NavWindow;
    IVar43 = (pIVar21->InnerRect).Min;
    fVar51 = (pIVar21->Pos).x;
    fVar52 = (pIVar21->Pos).y;
    IVar45 = (pIVar21->InnerRect).Max;
    local_48.Max.x = (IVar45.x - fVar51) + 1.0;
    local_48.Max.y = (IVar45.y - fVar52) + 1.0;
    local_48.Min.y = (IVar43.y - fVar52) + -1.0;
    local_48.Min.x = (IVar43.x - fVar51) + -1.0;
    bVar13 = ImRect::Contains(&local_48,pIVar21->NavRectRel);
    if (!bVar13) {
      fVar51 = ImGuiWindow::CalcFontSize(pIVar21);
      auVar54._0_4_ = fVar51 * 0.5;
      auVar53._0_4_ = local_48.Max.x - local_48.Min.x;
      auVar53._4_4_ = local_48.Max.y - local_48.Min.y;
      auVar53._8_4_ = local_48.Max.x - local_48.Max.x;
      auVar53._12_4_ = local_48.Max.y - local_48.Max.y;
      auVar54._4_4_ = auVar54._0_4_;
      auVar54._8_4_ = auVar54._0_4_;
      auVar54._12_4_ = auVar54._0_4_;
      auVar54 = minps(auVar53,auVar54);
      local_48.Max.x = local_48.Max.x - auVar54._0_4_;
      local_48.Max.y = local_48.Max.y - auVar54._4_4_;
      local_48.Min.y = auVar54._4_4_ + local_48.Min.y;
      local_48.Min.x = auVar54._0_4_ + local_48.Min.x;
      ImRect::ClipWith(pIVar21->NavRectRel + pIVar35->NavLayer,&local_48);
      pIVar35->NavId = 0;
      pIVar35->NavFocusScopeId = 0;
    }
    pIVar35->NavMoveFromClampedRefRect = false;
  }
  pIVar21 = pIVar35->NavWindow;
  if (pIVar21 == (ImGuiWindow *)0x0) {
    IVar45 = (GImGui->IO).DisplaySize;
    fVar51 = 0.0;
    fVar52 = 0.0;
  }
  else {
    IVar43 = pIVar21->NavRectRel[pIVar35->NavLayer].Min;
    IVar45 = pIVar21->NavRectRel[pIVar35->NavLayer].Max;
    fVar42 = IVar43.x;
    fVar57 = IVar43.y;
    IVar44.x = 0.0;
    IVar44.y = 0.0;
    fVar51 = 0.0;
    fVar52 = 0.0;
    if (fVar57 <= IVar45.y && fVar42 <= IVar45.x) {
      fVar51 = fVar42;
      fVar52 = fVar57;
      IVar44 = IVar45;
    }
    fVar42 = (pIVar21->Pos).x;
    fVar51 = fVar51 + fVar42;
    fVar57 = (pIVar21->Pos).y;
    fVar52 = fVar52 + fVar57;
    IVar45.x = IVar44.x + fVar42;
    IVar45.y = IVar44.y + fVar57;
  }
  (pIVar35->NavScoringRect).Min.y = fVar52 + fVar41;
  fVar57 = IVar45.y + fVar41;
  (pIVar35->NavScoringRect).Max.y = fVar57;
  fVar42 = fVar51 + 1.0;
  if (IVar45.x <= fVar51 + 1.0) {
    fVar42 = IVar45.x;
  }
  (pIVar35->NavScoringRect).Min.x = fVar42;
  (pIVar35->NavScoringRect).Max.x = fVar42;
  if (fVar57 < fVar52 + fVar41) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x2220,"NavUpdate","ImGui ASSERT FAILED: %s","!g.NavScoringRect.IsInverted()");
  }
  pIVar35->NavScoringCount = 0;
  pIVar35 = GImGui;
  pIVar5 = &(GImGui->IO).MousePos;
  bVar13 = IsMousePosValid(pIVar5);
  if (bVar13) {
    IVar43 = (pIVar35->IO).MousePos;
    IVar46.x = (float)(int)IVar43.x;
    IVar46.y = (float)(int)IVar43.y;
    pIVar35->LastValidMousePos = IVar46;
    (pIVar35->IO).MousePos = IVar46;
  }
  bVar13 = IsMousePosValid(pIVar5);
  if ((bVar13) && (bVar13 = IsMousePosValid(&(pIVar35->IO).MousePosPrev), bVar13)) {
    IVar43 = (pIVar35->IO).MousePos;
    IVar45 = (pIVar35->IO).MousePosPrev;
    IVar47.x = IVar43.x - IVar45.x;
    IVar47.y = IVar43.y - IVar45.y;
    (pIVar35->IO).MouseDelta = IVar47;
    if (((IVar47.x != 0.0) || (NAN(IVar47.x))) || ((IVar47.y != 0.0 || (NAN(IVar47.y))))) {
      pIVar35->NavDisableMouseHover = false;
    }
  }
  else {
    (pIVar35->IO).MouseDelta.x = 0.0;
    (pIVar35->IO).MouseDelta.y = 0.0;
  }
  (pIVar35->IO).MousePosPrev = (pIVar35->IO).MousePos;
  for (lVar33 = 0; lVar33 != 5; lVar33 = lVar33 + 1) {
    if ((pIVar35->IO).MouseDown[lVar33] == true) {
      fVar41 = (pIVar35->IO).MouseDownDuration[lVar33];
      pbVar34 = (pIVar35->IO).MouseClicked + lVar33;
      *pbVar34 = fVar41 < 0.0;
      pbVar34[10] = false;
      (pIVar35->IO).MouseDownDurationPrev[lVar33] = fVar41;
      if (0.0 <= fVar41) {
        (pIVar35->IO).MouseDownDuration[lVar33] = fVar41 + (pIVar35->IO).DeltaTime;
        (pIVar35->IO).MouseDoubleClicked[lVar33] = false;
        bVar13 = IsMousePosValid(pIVar5);
        auVar50 = ZEXT816(0);
        if (bVar13) {
          IVar43 = (pIVar35->IO).MousePos;
          IVar45 = (pIVar35->IO).MouseClickedPos[lVar33];
          auVar50._0_4_ = IVar43.x - IVar45.x;
          auVar50._4_4_ = IVar43.y - IVar45.y;
          auVar50._8_8_ = 0;
        }
        fVar41 = (pIVar35->IO).MouseDragMaxDistanceSqr[lVar33];
        fVar51 = auVar50._0_4_ * auVar50._0_4_ + auVar50._4_4_ * auVar50._4_4_;
        uVar39 = -(uint)(fVar51 <= fVar41);
        (pIVar35->IO).MouseDragMaxDistanceSqr[lVar33] =
             (float)(~uVar39 & (uint)fVar51 | (uint)fVar41 & uVar39);
        IVar43 = (pIVar35->IO).MouseDragMaxDistanceAbs[lVar33];
        fVar41 = IVar43.x;
        fVar51 = IVar43.y;
        auVar55._0_8_ = auVar50._0_8_ ^ 0x8000000080000000;
        auVar55._8_4_ = auVar50._8_4_ ^ 0x80000000;
        auVar55._12_4_ = auVar50._12_4_ ^ 0x80000000;
        auVar54 = maxps(auVar55,auVar50);
        uVar39 = -(uint)(auVar54._0_4_ <= fVar41);
        uVar40 = -(uint)(auVar54._4_4_ <= fVar51);
        (pIVar35->IO).MouseDragMaxDistanceAbs[lVar33] =
             (ImVec2)(CONCAT44(~uVar40 & (uint)auVar54._4_4_,~uVar39 & (uint)auVar54._0_4_) |
                     CONCAT44((uint)fVar51 & uVar40,(uint)fVar41 & uVar39));
      }
      else {
        (pIVar35->IO).MouseDownDuration[lVar33] = 0.0;
        (pIVar35->IO).MouseDoubleClicked[lVar33] = false;
        dVar48 = pIVar35->Time;
        if ((float)(dVar48 - (pIVar35->IO).MouseClickedTime[lVar33]) <
            (pIVar35->IO).MouseDoubleClickTime) {
          bVar13 = IsMousePosValid(pIVar5);
          fVar41 = 0.0;
          fVar51 = 0.0;
          if (bVar13) {
            IVar43 = (pIVar35->IO).MousePos;
            IVar45 = (pIVar35->IO).MouseClickedPos[lVar33];
            fVar41 = IVar43.x - IVar45.x;
            fVar51 = IVar43.y - IVar45.y;
          }
          fVar52 = (pIVar35->IO).MouseDoubleClickMaxDist;
          if (fVar41 * fVar41 + fVar51 * fVar51 < fVar52 * fVar52) {
            (pIVar35->IO).MouseDoubleClicked[lVar33] = true;
          }
          dVar48 = (double)((pIVar35->IO).MouseDoubleClickTime * -2.0);
        }
        (pIVar35->IO).MouseClickedTime[lVar33] = dVar48;
        (pIVar35->IO).MouseClickedPos[lVar33] = (pIVar35->IO).MousePos;
        (pIVar35->IO).MouseDownWasDoubleClick[lVar33] = (pIVar35->IO).MouseDoubleClicked[lVar33];
        pIVar6 = (pIVar35->IO).MouseDragMaxDistanceAbs + lVar33;
        pIVar6->x = 0.0;
        pIVar6->y = 0.0;
        (pIVar35->IO).MouseDragMaxDistanceSqr[lVar33] = 0.0;
      }
    }
    else {
      (pIVar35->IO).MouseClicked[lVar33] = false;
      fVar41 = (pIVar35->IO).MouseDownDuration[lVar33];
      (pIVar35->IO).MouseReleased[lVar33] = 0.0 <= fVar41;
      pbVar34 = (pIVar35->IO).MouseClicked + lVar33;
      (pIVar35->IO).MouseDownDurationPrev[lVar33] = fVar41;
      (pIVar35->IO).MouseDownDuration[lVar33] = -1.0;
      (pIVar35->IO).MouseDoubleClicked[lVar33] = false;
    }
    if (((pIVar35->IO).MouseDown[lVar33] == false) && ((pIVar35->IO).MouseReleased[lVar33] == false)
       ) {
      (pIVar35->IO).MouseDownWasDoubleClick[lVar33] = false;
    }
    if (*pbVar34 == true) {
      pIVar35->NavDisableMouseHover = false;
    }
  }
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar21 = GetTopMostPopupModal();
  if ((pIVar21 != (ImGuiWindow *)0x0) ||
     ((pIVar11->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar11->NavWindowingHighlightAlpha)))) {
    fVar41 = (pIVar11->IO).DeltaTime * 6.0 + pIVar11->DimBgRatio;
    if (1.0 <= fVar41) {
      fVar41 = 1.0;
    }
    pIVar11->DimBgRatio = fVar41;
  }
  else {
    fVar41 = (pIVar11->IO).DeltaTime * -10.0 + pIVar11->DimBgRatio;
    pIVar11->DimBgRatio = (float)(-(uint)(0.0 <= fVar41) & (uint)fVar41);
  }
  pIVar11->MouseCursor = 0;
  pIVar11->WantTextInputNextFrame = -1;
  pIVar11->WantCaptureMouseNextFrame = -1;
  pIVar11->WantCaptureKeyboardNextFrame = -1;
  (pIVar11->PlatformImePos).x = 1.0;
  pIVar35 = GImGui;
  (pIVar11->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar13 = IsMousePosValid((ImVec2 *)0x0);
    if (((bVar13) &&
        (fVar41 = (pIVar35->IO).MouseDragThreshold,
        fVar51 = (pIVar35->IO).MousePos.x - (pIVar35->WheelingWindowRefMousePos).x,
        fVar52 = (pIVar35->IO).MousePos.y - (pIVar35->WheelingWindowRefMousePos).y,
        fVar41 * fVar41 < fVar51 * fVar51 + fVar52 * fVar52)) ||
       (pIVar35->WheelingWindowTimer <= 0.0)) {
      pIVar35->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar35->WheelingWindowTimer = 0.0;
    }
  }
  fVar41 = (pIVar35->IO).MouseWheel;
  if (((((fVar41 != 0.0) || (fVar51 = (pIVar35->IO).MouseWheelH, fVar51 != 0.0)) || (NAN(fVar51)))
      && ((pIVar21 = pIVar35->WheelingWindow, pIVar21 != (ImGuiWindow *)0x0 ||
          (pIVar21 = pIVar35->HoveredWindow, pIVar21 != (ImGuiWindow *)0x0)))) &&
     (pIVar21->Collapsed == false)) {
    if ((fVar41 != 0.0) || (NAN(fVar41))) {
      if ((pIVar35->IO).KeyCtrl == true) {
        if ((pIVar35->IO).FontAllowUserScaling == true) {
          StartLockWheelingWindow(pIVar21);
          fVar41 = pIVar21->FontWindowScale;
          fVar52 = (pIVar35->IO).MouseWheel * 0.1 + fVar41;
          fVar51 = 2.5;
          if (fVar52 <= 2.5) {
            fVar51 = fVar52;
          }
          fVar51 = (float)(-(uint)(fVar52 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar52 < 0.5) & (uint)fVar51);
          pIVar21->FontWindowScale = fVar51;
          if ((pIVar21->Flags & 0x1000000) == 0) {
            fVar51 = fVar51 / fVar41;
            IVar43 = pIVar21->Size;
            IVar45 = (pIVar35->IO).MousePos;
            fVar41 = (pIVar21->Pos).x;
            fVar52 = (pIVar21->Pos).y;
            auVar56._0_4_ = (IVar45.x - fVar41) * (1.0 - fVar51) * IVar43.x;
            auVar56._4_4_ = (IVar45.y - fVar52) * (1.0 - fVar51) * IVar43.y;
            auVar56._8_8_ = 0;
            auVar9._8_8_ = 0;
            auVar9._0_4_ = IVar43.x;
            auVar9._4_4_ = IVar43.y;
            auVar54 = divps(auVar56,auVar9);
            local_48.Min.x = auVar54._0_4_ + fVar41;
            local_48.Min.y = auVar54._4_4_ + fVar52;
            SetWindowPos(pIVar21,&local_48.Min,0);
            IVar49.x = (float)(int)((pIVar21->Size).x * fVar51);
            IVar49.y = (float)(int)((pIVar21->Size).y * fVar51);
            IVar8.y = (float)(int)((pIVar21->SizeFull).y * fVar51);
            IVar8.x = (float)(int)((pIVar21->SizeFull).x * fVar51);
            pIVar21->Size = IVar49;
            pIVar21->SizeFull = IVar8;
          }
          goto LAB_001d8b94;
        }
      }
      else if ((pIVar35->IO).KeyShift == false) {
        StartLockWheelingWindow(pIVar21);
        while ((uVar39 = pIVar21->Flags, (uVar39 >> 0x18 & 1) != 0 &&
               (((uVar39 & 0x210) == 0x10 ||
                ((fVar51 = (pIVar21->ScrollMax).y, fVar51 == 0.0 && (!NAN(fVar51)))))))) {
          pIVar21 = pIVar21->ParentWindow;
        }
        if ((uVar39 & 0x210) == 0) {
          fVar52 = ((pIVar21->InnerRect).Max.y - (pIVar21->InnerRect).Min.y) * 0.67;
          fVar42 = ImGuiWindow::CalcFontSize(pIVar21);
          fVar51 = fVar42 * 5.0;
          if (fVar52 <= fVar42 * 5.0) {
            fVar51 = fVar52;
          }
          (pIVar21->ScrollTarget).y = (pIVar21->Scroll).y - fVar41 * (float)(int)fVar51;
          (pIVar21->ScrollTargetCenterRatio).y = 0.0;
        }
      }
    }
    fVar41 = (pIVar35->IO).MouseWheelH;
    if (((fVar41 == 0.0) && (!NAN(fVar41))) || ((pIVar35->IO).KeyShift == true)) {
      fVar41 = (pIVar35->IO).MouseWheel;
      if (((fVar41 == 0.0) && (!NAN(fVar41))) || ((pIVar35->IO).KeyShift != true))
      goto LAB_001d8b94;
    }
    if ((pIVar35->IO).KeyCtrl == false) {
      StartLockWheelingWindow(pIVar21);
      while ((uVar39 = pIVar21->Flags, (uVar39 >> 0x18 & 1) != 0 &&
             (((uVar39 & 0x210) == 0x10 ||
              ((fVar51 = (pIVar21->ScrollMax).x, fVar51 == 0.0 && (!NAN(fVar51)))))))) {
        pIVar21 = pIVar21->ParentWindow;
      }
      if ((uVar39 & 0x210) == 0) {
        fVar52 = ((pIVar21->InnerRect).Max.x - (pIVar21->InnerRect).Min.x) * 0.67;
        fVar42 = ImGuiWindow::CalcFontSize(pIVar21);
        fVar51 = fVar42 + fVar42;
        if (fVar52 <= fVar42 + fVar42) {
          fVar51 = fVar52;
        }
        (pIVar21->ScrollTarget).x = (pIVar21->Scroll).x - fVar41 * (float)(int)fVar51;
        (pIVar21->ScrollTargetCenterRatio).x = 0.0;
      }
    }
  }
LAB_001d8b94:
  pIVar35 = GImGui;
  pIVar21 = GImGui->NavWindow;
  if ((((pIVar21 == (ImGuiWindow *)0x0) || (pIVar21->Active != true)) ||
      ((pIVar21->Flags & 0x40000) != 0)) || ((GImGui->IO).KeyCtrl != false)) {
    bVar13 = false;
  }
  else {
    bVar13 = IsKeyPressedMap(0,true);
  }
  pIVar35->FocusTabPressed = bVar13;
  if ((bVar13 == false) || (pIVar35->ActiveId != 0)) {
    pIVar21 = pIVar35->FocusRequestNextWindow;
  }
  else {
    pIVar21 = pIVar35->NavWindow;
    pIVar35->FocusRequestNextWindow = pIVar21;
    pIVar35->FocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar35->NavId == 0) || (pIVar35->NavIdTabCounter == 0x7fffffff)) {
      iVar19 = -(uint)(pIVar35->IO).KeyShift;
    }
    else {
      iVar19 = pIVar35->NavIdTabCounter + (-(uint)(pIVar35->IO).KeyShift | 1) + 1;
    }
    pIVar35->FocusRequestNextCounterTabStop = iVar19;
  }
  pIVar35->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar35->FocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar35->FocusRequestCurrCounterTabStop = 0x7fffffff;
  if (pIVar21 != (ImGuiWindow *)0x0) {
    pIVar35->FocusRequestCurrWindow = pIVar21;
    if ((pIVar35->FocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar19 = (pIVar21->DC).FocusCounterRegular, iVar19 != -1)) {
      pIVar35->FocusRequestCurrCounterRegular =
           (pIVar35->FocusRequestNextCounterRegular + iVar19 + 1) % (iVar19 + 1);
    }
    if ((pIVar35->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar19 = (pIVar21->DC).FocusCounterTabStop, iVar19 != -1)) {
      pIVar35->FocusRequestCurrCounterTabStop =
           (pIVar35->FocusRequestNextCounterTabStop + iVar19 + 1) % (iVar19 + 1);
    }
    pIVar35->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar35->FocusRequestNextCounterRegular = 0x7fffffff;
    pIVar35->FocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar35->NavIdTabCounter = 0x7fffffff;
  if ((pIVar11->WindowsFocusOrder).Size != (pIVar11->Windows).Size) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0xeff,"NewFrame","ImGui ASSERT FAILED: %s",
                "g.WindowsFocusOrder.Size == g.Windows.Size");
  }
  fVar41 = (pIVar11->IO).ConfigWindowsMemoryCompactTimer;
  if (0.0 <= fVar41) {
    fVar41 = (float)pIVar11->Time - fVar41;
  }
  else {
    fVar41 = 3.4028235e+38;
  }
  for (iVar19 = 0; iVar19 != (pIVar11->Windows).Size; iVar19 = iVar19 + 1) {
    ppIVar23 = ImVector<ImGuiWindow_*>::operator[](&pIVar11->Windows,iVar19);
    pIVar21 = *ppIVar23;
    bVar13 = pIVar21->Active;
    pIVar21->WasActive = bVar13;
    pIVar21->BeginCount = 0;
    pIVar21->Active = false;
    pIVar21->WriteAccessed = false;
    if (((bVar13 == false) && (pIVar21->MemoryCompacted == false)) &&
       (pIVar21->LastTimeActive <= fVar41 && fVar41 != pIVar21->LastTimeActive)) {
      GcCompactTransientWindowBuffers(pIVar21);
    }
  }
  if ((pIVar11->NavWindow != (ImGuiWindow *)0x0) && (pIVar11->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  ImVector<ImGuiWindow_*>::resize(&pIVar11->CurrentWindowStack,0);
  ImVector<ImGuiPopupData>::resize(&pIVar11->BeginPopupStack,0);
  ClosePopupsOverWindow(pIVar11->NavWindow,false);
  pIVar35 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar35->DebugItemPickerActive == true) {
    uVar39 = pIVar35->HoveredIdPreviousFrame;
    pIVar35->MouseCursor = 7;
    bVar13 = IsKeyPressedMap(0xe,true);
    if (bVar13) {
      pIVar35->DebugItemPickerActive = false;
    }
    pIVar12 = GImGui;
    fVar41 = (GImGui->IO).MouseDownDuration[0];
    if ((fVar41 != 0.0) || (NAN(fVar41))) {
      uVar40 = (uint)(uVar39 == 0);
    }
    else if (uVar39 == 0) {
      uVar40 = 1;
    }
    else {
      pIVar35->DebugItemPickerBreakId = uVar39;
      pIVar35->DebugItemPickerActive = false;
      uVar40 = 0;
    }
    pIVar4 = &pIVar12->NextWindowData;
    *(byte *)&pIVar4->Flags = (byte)pIVar4->Flags | 0x40;
    (pIVar12->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltip();
    Text("HoveredId: 0x%08X",(ulong)uVar39);
    Text("Press ESC to abort picking.");
    TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar40 << 4)),
                "Click to break in debugger!");
    EndTooltip();
    pIVar35 = GImGui;
  }
  pIVar11->WithinFrameScopeWithImplicitWindow = true;
  *(byte *)&(pIVar35->NextWindowData).Flags = (byte)(pIVar35->NextWindowData).Flags | 2;
  (pIVar35->NextWindowData).SizeVal.x = 400.0;
  (pIVar35->NextWindowData).SizeVal.y = 400.0;
  (pIVar35->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (pIVar11->CurrentWindow->IsFallbackWindow == false) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0xf21,"NewFrame","ImGui ASSERT FAILED: %s",
                "g.CurrentWindow->IsFallbackWindow == true");
  }
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleSegmentMaxError(g.Style.CircleSegmentMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    g.BackgroundDrawList._ResetForNewFrame();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();

    g.ForegroundDrawList._ResetForNewFrame();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.IO.ConfigWindowsMemoryCompactTimer >= 0.0f) ? (float)g.Time - g.IO.ConfigWindowsMemoryCompactTimer : FLT_MAX;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}